

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O1

int inhishop(monst *mtmp)

{
  boolean bVar1;
  uint uVar2;
  char *pcVar3;
  
  pcVar3 = in_rooms(mtmp->dlevel,mtmp->mx,mtmp->my,0x12);
  pcVar3 = strchr(pcVar3,(int)(char)mtmp[0x1b].meating);
  if (pcVar3 == (char *)0x0) {
    uVar2 = 0;
  }
  else {
    bVar1 = on_level((d_level *)&mtmp[0x1b].mxlth,&mtmp->dlevel->z);
    uVar2 = (uint)(bVar1 != '\0');
  }
  return uVar2;
}

Assistant:

int inhishop(struct monst *mtmp)
{
	return(strchr(in_rooms(mtmp->dlevel, mtmp->mx, mtmp->my, SHOPBASE),
		     ESHK(mtmp)->shoproom) &&
		on_level(&(ESHK(mtmp)->shoplevel), &mtmp->dlevel->z));
}